

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O3

ssize_t __thiscall
LinkedReadsDatastore::read(LinkedReadsDatastore *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pcVar1;
  ssize_t sVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  char *pcVar3;
  uint64_t count;
  char local_48 [8];
  string local_40;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  std::istream::read(pcVar3,(long)local_48);
  std::__cxx11::string::resize((ulong)this,local_48[0]);
  std::istream::read(pcVar3,(long)(this->filename)._M_dataplus._M_p);
  std::istream::read(pcVar3,(long)local_48);
  std::__cxx11::string::resize((ulong)&this->name,local_48[0]);
  std::istream::read(pcVar3,(long)(this->name)._M_dataplus._M_p);
  pcVar1 = (this->filename)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->filename)._M_string_length);
  load_index(this,&local_40);
  __buf_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    __buf_00 = extraout_RDX_00;
  }
  sVar2 = LinkedReadsMapper::read(&this->mapper,__fd,__buf_00,__nbytes);
  return sVar2;
}

Assistant:

void LinkedReadsDatastore::read(std::ifstream &input_file) {
    //read filename
    sdglib::read_string(input_file, filename);
    sdglib::read_string(input_file, name);

    load_index(filename);
    mapper.read(input_file);
}